

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QPointer<QTextFrame>>::emplace<QPointer<QTextFrame>>
          (QMovableArrayOps<QPointer<QTextFrame>> *this,qsizetype i,QPointer<QTextFrame> *args)

{
  undefined8 *puVar1;
  int *piVar2;
  long lVar3;
  Data *pDVar4;
  QObject *pQVar5;
  long lVar6;
  
  piVar2 = *(int **)this;
  if ((piVar2 != (int *)0x0) && (*piVar2 < 2)) {
    lVar3 = *(long *)(this + 0x10);
    if ((lVar3 == i && piVar2 != (int *)0x0) &&
       (*(long *)(piVar2 + 2) !=
        ((long)(*(long *)(this + 8) - ((long)piVar2 + 0x1fU & 0xfffffffffffffff0)) >> 4) + lVar3)) {
      pQVar5 = (args->wp).value;
      puVar1 = (undefined8 *)(*(long *)(this + 8) + lVar3 * 0x10);
      *puVar1 = (args->wp).d;
      puVar1[1] = pQVar5;
      (args->wp).d = (Data *)0x0;
      (args->wp).value = (QObject *)0x0;
      goto LAB_00500a29;
    }
    if (((i == 0) && (piVar2 != (int *)0x0)) &&
       (((long)piVar2 + 0x1fU & 0xfffffffffffffff0) != *(ulong *)(this + 8))) {
      lVar3 = *(long *)(this + 8);
      pQVar5 = (args->wp).value;
      *(Data **)(lVar3 + -0x10) = (args->wp).d;
      *(QObject **)(lVar3 + -8) = pQVar5;
      (args->wp).d = (Data *)0x0;
      (args->wp).value = (QObject *)0x0;
      *(long *)(this + 8) = *(long *)(this + 8) + -0x10;
      goto LAB_00500a29;
    }
  }
  pDVar4 = (args->wp).d;
  pQVar5 = (args->wp).value;
  (args->wp).d = (Data *)0x0;
  (args->wp).value = (QObject *)0x0;
  lVar3 = *(long *)(this + 0x10);
  QArrayDataPointer<QPointer<QTextFrame>_>::detachAndGrow
            ((QArrayDataPointer<QPointer<QTextFrame>_> *)this,(uint)(i == 0 && lVar3 != 0),1,
             (QPointer<QTextFrame> **)0x0,(QArrayDataPointer<QPointer<QTextFrame>_> *)0x0);
  lVar6 = *(long *)(this + 8);
  if (i == 0 && lVar3 != 0) {
    *(Data **)(lVar6 + -0x10) = pDVar4;
    *(QObject **)(lVar6 + -8) = pQVar5;
    *(long *)(this + 8) = lVar6 + -0x10;
  }
  else {
    puVar1 = (undefined8 *)(lVar6 + i * 0x10);
    memmove(puVar1 + 2,(void *)(lVar6 + i * 0x10),(*(long *)(this + 0x10) - i) * 0x10);
    *puVar1 = pDVar4;
    puVar1[1] = pQVar5;
  }
LAB_00500a29:
  *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }